

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall duckdb_parquet::BloomFilterHash::printTo(BloomFilterHash *this,ostream *out)

{
  ostream *poVar1;
  ostream *in_RSI;
  long in_RDI;
  XxHash *in_stack_00000138;
  string local_30 [32];
  ostream *local_10;
  
  local_10 = in_RSI;
  std::operator<<(in_RSI,"BloomFilterHash(");
  std::operator<<(local_10,"XXHASH=");
  poVar1 = local_10;
  if ((*(byte *)(in_RDI + 0x10) & 1) == 0) {
    std::operator<<(local_10,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::XxHash>(in_stack_00000138);
    std::operator<<(poVar1,local_30);
    std::__cxx11::string::~string(local_30);
  }
  std::operator<<(local_10,")");
  return;
}

Assistant:

void BloomFilterHash::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "BloomFilterHash(";
  out << "XXHASH="; (__isset.XXHASH ? (out << to_string(XXHASH)) : (out << "<null>"));
  out << ")";
}